

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

OneofOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::OneofOptions>
          (Tables *this,OneofOptions *param_1)

{
  OneofOptions *this_00;
  OneofOptions *result;
  
  this_00 = (OneofOptions *)operator_new(0x48);
  OneofOptions::OneofOptions(this_00);
  result = this_00;
  std::
  vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
  ::emplace_back<google::protobuf::OneofOptions*&>
            ((vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
              *)&this->messages_,&result);
  return result;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.emplace_back(result);
  return result;
}